

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O3

ssize_t __thiscall
sc_core::wif_unsigned_long_trace::write
          (wif_unsigned_long_trace *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  ulong __n_00;
  char buf [1000];
  byte local_408 [1008];
  
  uVar2 = *this->object;
  uVar1 = (this->super_wif_trace).bit_width;
  __n_00 = (ulong)uVar1;
  if ((uVar2 & ~this->mask) == 0) {
    if (0 < (int)uVar1) {
      uVar5 = 1L << ((char)uVar1 - 1U & 0x3f);
      uVar4 = 0;
      do {
        local_408[uVar4] = (uVar2 & uVar5) == 0 ^ 0x31;
        uVar5 = uVar5 >> 1;
        uVar4 = uVar4 + 1;
      } while (__n_00 != uVar4);
      goto LAB_0020f91e;
    }
  }
  else if (0 < (int)uVar1) {
    memset(local_408,0x30,__n_00);
    goto LAB_0020f91e;
  }
  __n_00 = 0;
LAB_0020f91e:
  local_408[__n_00] = 0;
  fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"assign %s \"%s\" ;\n",
          (this->super_wif_trace).wif_name._M_dataplus._M_p,local_408);
  uVar3 = *this->object;
  this->old_value = uVar3;
  return uVar3;
}

Assistant:

void wif_unsigned_long_trace::write(FILE* f)
{
    char buf[1000];
    int bitindex;

    // Check for overflow
    if ((object & mask) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex]='0';
        }
    }
    else{
        unsigned long bit_mask = 1ul << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    buf[bitindex] = '\0';
    std::fprintf(f, "assign %s \"%s\" ;\n", wif_name.c_str(), buf);
    old_value = object;
}